

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipstats.cpp
# Opt level: O1

void __thiscall IPStatsRecord::IPStatsRecord(IPStatsRecord *this)

{
  memset(this,0,0x368);
  return;
}

Assistant:

IPStatsRecord::IPStatsRecord() :
    ipaddr_length(0),
    query_volume(0),
    arpa_count(0),
    no_such_domain_queries(0),
    no_such_domain_reserved(0),
    no_such_domain_frequent(0),
    no_such_domain_chromioids(0),
    HashNext(NULL)
{
    memset(ip_addr, 0, sizeof(ip_addr));
    memset(hourly_volume, 0, sizeof(hourly_volume));
    memset(daily_volume, 0, sizeof(daily_volume));
    memset(tld_counts, 0, sizeof(tld_counts));
    memset(sld_counts, 0, sizeof(sld_counts));
    memset(name_parts, 0, sizeof(name_parts));
    memset(rr_types, 0, sizeof(rr_types));
    memset(locales, 0, sizeof(locales));
}